

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O2

QRect __thiscall QColumnView::visualRect(QColumnView *this,QModelIndex *index)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  QRect QVar9;
  
  uVar7 = 0xffffffff00000000;
  uVar6 = 0xffffffff;
  bVar3 = QModelIndex::isValid(index);
  if (bVar3) {
    lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                      super_QWidget.field_0x8;
    uVar6 = 0;
    do {
      if (*(ulong *)(lVar1 + 0x550) <= uVar6) {
        uVar4 = 0;
        uVar5 = 0;
        uVar6 = 0xffffffff;
        uVar7 = 0xffffffff00000000;
        goto LAB_0050a587;
      }
      plVar2 = *(long **)(*(long *)(lVar1 + 0x548) + uVar6 * 8);
      auVar8 = (**(code **)(*plVar2 + 0x1e0))(plVar2,index);
      uVar6 = uVar6 + 1;
    } while ((auVar8._0_4_ + -1 == auVar8._8_4_) && (auVar8._4_4_ + -1 == auVar8._12_4_));
    QVar9 = QWidget::frameGeometry(*(QWidget **)(*(long *)(lVar1 + 0x548) + -8 + uVar6 * 8));
    uVar4 = (ulong)(uint)(auVar8._0_4_ + QVar9.x1.m_i.m_i);
    uVar6 = (ulong)(uint)(auVar8._8_4_ + QVar9.x1.m_i.m_i);
    uVar5 = (ulong)(uint)(auVar8._4_4_ + QVar9.y1.m_i.m_i) << 0x20;
    uVar7 = (ulong)(uint)(auVar8._12_4_ + QVar9.y1.m_i.m_i) << 0x20;
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
  }
LAB_0050a587:
  QVar9.x2.m_i = (int)(uVar6 | uVar7);
  QVar9.y2.m_i = (int)((uVar6 | uVar7) >> 0x20);
  QVar9.x1.m_i = (int)(uVar4 | uVar5);
  QVar9.y1.m_i = (int)((uVar4 | uVar5) >> 0x20);
  return QVar9;
}

Assistant:

QRect QColumnView::visualRect(const QModelIndex &index) const
{
    if (!index.isValid())
        return QRect();

    Q_D(const QColumnView);
    for (int i = 0; i < d->columns.size(); ++i) {
        QRect rect = d->columns.at(i)->visualRect(index);
        if (!rect.isNull()) {
            rect.translate(d->columns.at(i)->frameGeometry().topLeft());
            return rect;
        }
    }
    return QRect();
}